

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O2

void store_ref_to_cpb(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  EncFrmStatus EVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  
  uVar1 = frm->val;
  uVar5 = uVar1;
  if ((uVar1 & 1) == 0) {
    _mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"frm->valid",
               "store_ref_to_cpb",0x1ff);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
    uVar5 = frm->val;
  }
  if ((uVar5 & 0x40) == 0) {
    if ((uVar5 & 0x10) != 0) {
      cpb->mode_refs[3].val = uVar5;
      uVar5 = frm->val;
    }
    uVar4 = (uint)(uVar1 >> 0xc) & 0xf;
    if ((char)uVar5 < '\0') {
      uVar7 = (uint)uVar1 >> 8 & 0xf;
      cpb->lt_idx_refs[uVar7].val = uVar5;
      EVar2 = *frm;
      cpb->st_tid_refs[uVar4] = EVar2;
      cpb->mode_refs[0] = EVar2;
      EVar2 = *frm;
      cpb->mode_refs[2] = EVar2;
      pcVar6 = "add";
      for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
        if ((cpb->cpb_refs[uVar5 + 0x10].val & 1) == 0) {
LAB_0014bcd9:
          cpb->cpb_refs[uVar5 + 0x10] = EVar2;
          if (((byte)enc_refs_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_enc_refs","frm %d with lt idx %d %s to pos %d\n","store_ref_to_cpb",
                       uVar1 >> 0x30,(ulong)uVar7,pcVar6,uVar5);
          }
          goto LAB_0014bd15;
        }
        if (((uint)(cpb->cpb_refs[uVar5 + 0x10].val >> 8) & 0xf) == uVar7) {
          if (uVar5 < 0x10) {
            pcVar6 = "replace";
            goto LAB_0014bcd9;
          }
          break;
        }
      }
      _mpp_log_l(2,"mpp_enc_refs","frm %d with lt idx %d found no place to add or relace\n",
                 "store_ref_to_cpb",uVar1 >> 0x30,(ulong)uVar7);
    }
    else {
      cpb->st_tid_refs[uVar4].val = uVar5;
      EVar2 = *frm;
      cpb->mode_refs[0] = EVar2;
      cpb->mode_refs[1] = EVar2;
      for (lVar3 = 0x13; lVar3 != 4; lVar3 = lVar3 + -1) {
        cpb->cpb_refs[lVar3 + -4] = cpb->cpb_refs[lVar3 + -5];
      }
      cpb->cpb_refs[0] = *frm;
    }
LAB_0014bd15:
    if (((byte)enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","dumping cpb refs status start\n","store_ref_to_cpb");
      if (((byte)enc_refs_debug & 2) != 0) {
        for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 8) {
          if ((*(byte *)((long)cpb->cpb_refs + lVar3) & 1) != 0) {
            _dump_frm((EncFrmStatus *)((long)cpb->cpb_refs + lVar3),"store_ref_to_cpb",0x23d);
          }
        }
        if (((byte)enc_refs_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_enc_refs","dumping cpb refs status done\n","store_ref_to_cpb");
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void store_ref_to_cpb(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 lt_idx = frm->lt_idx;
    RK_S32 tid = frm->temporal_id;
    RK_S32 i;

    mpp_assert(frm->valid);
    mpp_assert(lt_idx < MAX_CPB_LT_IDX);
    mpp_assert(tid < MAX_CPB_LT_FRM);

    /* non-ref do not save to cpb */
    if (frm->is_non_ref)
        return ;

    if (frm->is_intra)
        cpb->mode_refs[REF_TO_PREV_INTRA].val = frm->val;

    if (frm->is_lt_ref) {
        cpb->lt_idx_refs[lt_idx].val = frm->val;
        cpb->st_tid_refs[tid].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_REF_FRM].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_LT_REF].val = frm->val;

        RK_S32 found = 0;
        EncFrmStatus *cpb_ref = NULL;

        /* find same lt_idx and replace */
        for (i = 0; i < MAX_CPB_LT_FRM; i++) {
            RK_S32 cpb_idx = i + MAX_CPB_ST_FRM;
            cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (!cpb_ref->valid) {
                found = 1;
                break;
            } else {
                if (cpb_ref->lt_idx == lt_idx) {
                    found = 2;
                    break;
                }
            }
        }

        if (found) {
            cpb_ref->val = frm->val;
            enc_refs_dbg_flow("frm %d with lt idx %d %s to pos %d\n",
                              seq_idx, lt_idx, (found == 1) ? "add" : "replace", i);
        } else {
            mpp_err_f("frm %d with lt idx %d found no place to add or relace\n",
                      seq_idx, lt_idx);
        }
    } else {
        /* do normal st sliding window */
        cpb->st_tid_refs[tid].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_REF_FRM].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_ST_REF].val = frm->val;

        for (i = MAX_CPB_ST_FRM - 1; i > 0; i--)
            cpb->cpb_refs[i].val = cpb->cpb_refs[i - 1].val;

        cpb->cpb_refs[0].val = frm->val;

        // TODO: Add prev intra valid check?
    }

    enc_refs_dbg_flow("dumping cpb refs status start\n");
    if (enc_refs_debug & MPP_ENC_REFS_DBG_FLOW)
        for (i = 0; i < MAX_CPB_FRM; i++)
            if (cpb->cpb_refs[i].valid)
                dump_frm(&cpb->cpb_refs[i]);

    enc_refs_dbg_flow("dumping cpb refs status done\n");
}